

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O3

void __thiscall
Diligent::FramebufferBase<Diligent::EngineVkImplTraits>::~FramebufferBase
          (FramebufferBase<Diligent::EngineVkImplTraits> *this)

{
  uint uVar1;
  int iVar2;
  IMemoryAllocator *pIVar3;
  undefined4 extraout_var;
  char (*in_RCX) [27];
  ulong uVar4;
  ulong uVar5;
  string msg;
  string local_38;
  
  (this->
  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
  ).super_ObjectBase<Diligent::IFramebufferVk>.super_RefCountedObject<Diligent::IFramebufferVk>.
  super_IFramebufferVk.super_IFramebuffer.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00af15b0;
  uVar1 = (this->
          super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
          ).m_Desc.AttachmentCount;
  if (uVar1 == 0) goto LAB_002c1033;
  if (this->m_ppAttachments == (ITextureView **)0x0) {
    FormatString<char[26],char[27]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ppAttachments != nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"~FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0xac);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    uVar1 = (this->
            super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
            ).m_Desc.AttachmentCount;
    if (uVar1 != 0) goto LAB_002c0ffe;
  }
  else {
LAB_002c0ffe:
    uVar4 = 0;
    do {
      if (this->m_ppAttachments[uVar4] != (ITextureView *)0x0) {
        (*(this->m_ppAttachments[uVar4]->super_IDeviceObject).super_IObject._vptr_IObject[2])();
        uVar1 = (this->
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                ).m_Desc.AttachmentCount;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar1);
  }
  pIVar3 = GetRawAllocator();
  (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_ppAttachments);
LAB_002c1033:
  if (this->m_ppReadOnlyDSVs != (ITextureView **)0x0) {
    iVar2 = (*(((this->
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    uVar4 = (ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x18);
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        if (this->m_ppReadOnlyDSVs[uVar5] != (ITextureView *)0x0) {
          (*(this->m_ppReadOnlyDSVs[uVar5]->super_IDeviceObject).super_IObject._vptr_IObject[2])();
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    pIVar3 = GetRawAllocator();
    (*pIVar3->_vptr_IMemoryAllocator[1])(pIVar3,this->m_ppReadOnlyDSVs);
  }
  (*(((this->
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
  DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
  ::~DeviceObjectBase(&this->
                       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                     );
  return;
}

Assistant:

~FramebufferBase()
    {
        if (this->m_Desc.AttachmentCount > 0)
        {
            VERIFY_EXPR(m_ppAttachments != nullptr);
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                if (m_ppAttachments[i] != nullptr)
                    m_ppAttachments[i]->Release();
            }
            GetRawAllocator().Free(m_ppAttachments);
        }

        if (m_ppReadOnlyDSVs != nullptr)
        {
            const auto SubpassCount = this->m_Desc.pRenderPass->GetDesc().SubpassCount;
            for (Uint32 i = 0; i < SubpassCount; ++i)
            {
                if (m_ppReadOnlyDSVs[i] != nullptr)
                    m_ppReadOnlyDSVs[i]->Release();
            }
            GetRawAllocator().Free(m_ppReadOnlyDSVs);
        }

        this->m_Desc.pRenderPass->Release();
    }